

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

void __thiscall RigidBodyDynamics::Model::Model(Model *this)

{
  uint uVar1;
  double *pdVar2;
  SpatialVector_t *this_00;
  double *v0;
  Vector3_t *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  key_type *__k;
  allocator<char> *__a;
  SpatialTransform *this_03;
  Joint *this_04;
  long in_RDI;
  double *v1;
  SpatialRigidBodyInertia rbi;
  SpatialVector zero_spatial;
  Vector3d zero_position;
  Joint root_joint;
  Body root_body;
  allocator_type *in_stack_fffffffffffff728;
  value_type *__x;
  SpatialMatrix_t *in_stack_fffffffffffff730;
  value_type *in_stack_fffffffffffff738;
  SpatialRigidBodyInertia *in_stack_fffffffffffff740;
  SpatialTransform *in_stack_fffffffffffff750;
  Body *in_stack_fffffffffffff760;
  double *in_stack_fffffffffffff768;
  double *in_stack_fffffffffffff770;
  double *in_stack_fffffffffffff778;
  Vector3_t *in_stack_fffffffffffff780;
  double *in_stack_fffffffffffff788;
  double *in_stack_fffffffffffff790;
  double *in_stack_fffffffffffff798;
  allocator<char> local_739;
  string local_738 [312];
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined4 local_41c;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined4 local_14c;
  value_type local_148;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  Joint local_b8;
  Body local_a0;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x84161f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x841638);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x841651);
  Vector3_t::Vector3_t((Vector3_t *)0x841662);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841685);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x8416ab);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x8416ce);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x8416f4);
  Eigen::aligned_allocator<RigidBodyDynamics::Joint>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Joint> *)0x841717);
  std::vector<RigidBodyDynamics::Joint,_std::allocator<RigidBodyDynamics::Joint>_>::vector
            ((vector<RigidBodyDynamics::Joint,_std::allocator<RigidBodyDynamics::Joint>_> *)
             in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Joint>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Joint> *)0x84173d);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841760);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841786);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x8417a9);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::vector((vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x8417cf);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x8417f2);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841818);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x84183b);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841861);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x84187d);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x8418a0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::vector((vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x8418c6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8418e2);
  Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::aligned_allocator
            ((aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)0x841905);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_std::allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_std::allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::~aligned_allocator
            ((aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)0x84192b);
  Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::aligned_allocator
            ((aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)0x84194e);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_std::allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_std::allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::~aligned_allocator
            ((aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)0x841974);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::vector
            ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)0x841990);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)0x8419ac);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8419c8);
  std::vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>::
  vector((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
          *)0x8419e4);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841a07);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841a2d);
  Eigen::aligned_allocator<SpatialMatrix_t>::aligned_allocator
            ((aligned_allocator<SpatialMatrix_t> *)0x841a50);
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::vector
            ((vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialMatrix_t>::~aligned_allocator
            ((aligned_allocator<SpatialMatrix_t> *)0x841a76);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841a99);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841abf);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841ae2);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841b08);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x841b24);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x841b42);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841b67);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841b8d);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia> *)0x841bb0);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_std::allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::vector((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_std::allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia> *)0x841bd6);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia> *)0x841bf9);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_std::allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::vector((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_std::allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia> *)0x841c1f);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841c42);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841c68);
  Eigen::aligned_allocator<SpatialVector_t>::aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841c8b);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff730,
             (allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<SpatialVector_t>::~aligned_allocator
            ((aligned_allocator<SpatialVector_t> *)0x841cb1);
  pdVar2 = (double *)(in_RDI + 0x2e8);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x841cd4);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::vector((vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x841cfa);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x841d1d);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::vector((vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            *)in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Math::SpatialTransform> *)0x841d43);
  this_00 = (SpatialVector_t *)(in_RDI + 0x318);
  Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::FixedBody> *)0x841d66);
  std::vector<RigidBodyDynamics::FixedBody,_std::allocator<RigidBodyDynamics::FixedBody>_>::vector
            ((vector<RigidBodyDynamics::FixedBody,_std::allocator<RigidBodyDynamics::FixedBody>_> *)
             in_stack_fffffffffffff730,(allocator_type *)in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::FixedBody> *)0x841d8c);
  v0 = (double *)(in_RDI + 0x338);
  Eigen::aligned_allocator<RigidBodyDynamics::Body>::aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Body> *)0x841daf);
  std::vector<RigidBodyDynamics::Body,_std::allocator<RigidBodyDynamics::Body>_>::vector
            ((vector<RigidBodyDynamics::Body,_std::allocator<RigidBodyDynamics::Body>_> *)
             in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  Eigen::aligned_allocator<RigidBodyDynamics::Body>::~aligned_allocator
            ((aligned_allocator<RigidBodyDynamics::Body> *)0x841dd5);
  v1 = (double *)(in_RDI + 0x350);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)0x841dee);
  Body::Body(in_stack_fffffffffffff760);
  Joint::Joint(&local_b8);
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 0;
  Vector3_t::Vector3_t
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768);
  local_148.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_148.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 0.0;
  local_148.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  local_148.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 0.0;
  local_148.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 0.0;
  local_148.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = 0.0;
  __x = &local_148;
  SpatialVector_t::SpatialVector_t
            (this_00,v0,v1,in_stack_fffffffffffff798,in_stack_fffffffffffff790,
             in_stack_fffffffffffff788,pdVar2);
  local_14c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff730,
             (value_type_conflict *)__x);
  local_150 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff730,
             (value_type_conflict *)__x);
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x841f66);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_fffffffffffff730,(value_type *)__x);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff740);
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  local_188 = 0;
  local_190 = 0xc0239eb851eb851f;
  local_198 = 0;
  Vector3_t::Vector3_t
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768);
  Vector3_t::operator=((Vector3_t *)in_stack_fffffffffffff730,(Vector3_t *)__x);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
  push_back((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_> *
            )in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff750);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff730,__x);
  this_01 = (Vector3_t *)(in_RDI + 0xd0);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff750);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff730,__x);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  pdVar2 = (double *)(in_RDI + 0x160);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
  Eigen::Matrix<double,6,3,0,6,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff730,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)__x);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               *)in_stack_fffffffffffff730,(value_type *)__x);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x178);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
  Eigen::Matrix<double,6,3,0,6,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff730,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)__x);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               *)in_stack_fffffffffffff730,(value_type *)__x);
  __k = (key_type *)(in_RDI + 400);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffff730,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)__x);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back
            ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)in_stack_fffffffffffff730,&__x->E);
  __a = (allocator<char> *)(in_RDI + 0x1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffff730,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)__x);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffff730,
             (value_type *)__x);
  local_41c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff730,
             (value_type_conflict *)__x);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  SpatialMatrix_t::
  SpatialMatrix_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (in_stack_fffffffffffff730,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
              *)__x);
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::push_back
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
             in_stack_fffffffffffff730,(value_type *)__x);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffff738);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff730,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)__x);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffff738);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff730,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)__x);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  local_5f0 = 0;
  local_5f8 = 0;
  local_600 = 0;
  Vector3_t::Vector3_t(this_01,pdVar2,(double *)this_02,(double *)__k);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffff730,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)__x);
  Math::SpatialRigidBodyInertia::SpatialRigidBodyInertia
            (in_stack_fffffffffffff740,(Scalar)in_stack_fffffffffffff738,
             (Vector3d *)in_stack_fffffffffffff730,&__x->E);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               *)in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               *)in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff740,(value_type *)in_stack_fffffffffffff738);
  this_03 = (SpatialTransform *)(in_RDI + 0x2e8);
  Math::SpatialTransform::SpatialTransform(this_03);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff730,__x);
  Math::SpatialTransform::SpatialTransform(this_03);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff730,__x);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  push_back((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
            in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__k,__a);
  this_04 = (Joint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)this_02,__k);
  *(mapped_type *)&this_04->mJointAxes = 0;
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_739);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  *(uint *)(in_RDI + 0x330) = uVar1 >> 1;
  Joint::~Joint(this_04);
  Body::~Body(&local_a0);
  return;
}

Assistant:

Model::Model()
{
  Body root_body;
  Joint root_joint;

  Vector3d zero_position (0., 0., 0.);
  SpatialVector zero_spatial (0., 0., 0., 0., 0., 0.);

  // structural information
  lambda.push_back(0);
  lambda_q.push_back(0);
  mu.push_back(std::vector<unsigned int>());
  dof_count = 0;
  q_size = 0;
  qdot_size = 0;
  previously_added_body_id = 0;

  gravity = Vector3d (0., -9.81, 0.);

  // state information
  v.push_back(zero_spatial);
  a.push_back(zero_spatial);

  // Joints
  mJoints.push_back(root_joint);
  S.push_back (zero_spatial);
  X_T.push_back(SpatialTransform());

  X_J.push_back (SpatialTransform());
  v_J.push_back (zero_spatial);
  c_J.push_back (zero_spatial);

  // Spherical joints
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  // Dynamic variables
  c.push_back(zero_spatial);
  IA.push_back(SpatialMatrix::Identity());
  pA.push_back(zero_spatial);
  U.push_back(zero_spatial);

  u = VectorNd::Zero(1);
  d = VectorNd::Zero(1);

  f.push_back (zero_spatial);
  SpatialRigidBodyInertia rbi(0.,
                              Vector3d (0., 0., 0.),
                              Matrix3d::Zero());
  Ic.push_back (rbi);
  I.push_back(rbi);
  hc.push_back (zero_spatial);
  hdotc.push_back (zero_spatial);

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());

  mBodies.push_back(root_body);
  mBodyNameMap["ROOT"] = 0;

  fixed_body_discriminator = std::numeric_limits<unsigned int>::max() / 2;
}